

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_view_data.hpp
# Opt level: O2

void duckdb::ArrowListViewData<int>::Initialize
               (ArrowAppendData *result,LogicalType *type,idx_t capacity)

{
  LogicalType *type_00;
  ArrowBuffer *pAVar1;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  child_buffer;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  type_00 = ListType::GetChildType(type);
  pAVar1 = ArrowAppendData::GetMainBuffer(result);
  ArrowBuffer::reserve(pAVar1,capacity * 4);
  pAVar1 = ArrowAppendData::GetAuxBuffer(result);
  ArrowBuffer::reserve(pAVar1,capacity * 4);
  local_40._8_8_ = (pointer)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ArrowAppender::InitializeChild
            ((ArrowAppender *)local_40,type_00,capacity,&result->options,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)(local_40 + 8));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
              *)&result->child_data,
             (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
              *)local_40);
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              local_40);
  return;
}

Assistant:

static void Initialize(ArrowAppendData &result, const LogicalType &type, idx_t capacity) {
		auto &child_type = ListType::GetChildType(type);
		result.GetMainBuffer().reserve(capacity * sizeof(BUFTYPE));
		result.GetAuxBuffer().reserve(capacity * sizeof(BUFTYPE));

		auto child_buffer = ArrowAppender::InitializeChild(child_type, capacity, result.options);
		result.child_data.push_back(std::move(child_buffer));
	}